

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::list_caster<std::vector<LinkView,std::allocator<LinkView>>,LinkView>::
       cast<std::vector<LinkView,std::allocator<LinkView>>>
                 (vector<LinkView,_std::allocator<LinkView>_> *src,return_value_policy policy,
                 handle parent)

{
  itype *piVar1;
  handle hVar2;
  long lVar3;
  PyObject *tmp;
  itype *src_00;
  list l;
  object value_;
  
  list::list(&l,(*(long *)(src + 8) - *(long *)src) / 0x28);
  src_00 = *(itype **)src;
  piVar1 = *(itype **)(src + 8);
  lVar3 = 0;
  do {
    hVar2.m_ptr = (PyObject *)l.super_object.super_handle.m_ptr;
    if (src_00 == piVar1) {
      l.super_object.super_handle.m_ptr = (object)(handle)0x0;
      goto LAB_001d5d92;
    }
    hVar2 = type_caster_base<LinkView>::cast(src_00,move,parent);
    value_.super_handle = hVar2;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
      *(PyObject **)(*(long *)((long)l.super_object.super_handle.m_ptr + 0x18) + lVar3 * 8) =
           hVar2.m_ptr;
      lVar3 = lVar3 + 1;
    }
    object::~object(&value_);
    src_00 = src_00 + 0x28;
  } while (hVar2.m_ptr != (PyObject *)0x0);
  hVar2.m_ptr = (PyObject *)0x0;
LAB_001d5d92:
  object::~object(&l.super_object);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }